

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::ExtractDebugVisitor::visit(ExtractDebugVisitor *this,AssignStmt *stmt)

{
  AssignStmt *stmt_local;
  ExtractDebugVisitor *this_local;
  
  process_stmt(this,&stmt->super_Stmt);
  return;
}

Assistant:

void visit(AssignStmt *stmt) override { process_stmt(stmt); }